

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O3

void av1_build_compound_diffwtd_mask_highbd_c
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,uint8_t *src0,int src0_stride,
               uint8_t *src1,int src1_stride,int h,int w,int bd)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  undefined7 in_register_00000031;
  long lVar6;
  uint8_t uVar7;
  ushort uVar8;
  ulong uVar9;
  ushort uVar10;
  int iVar11;
  
  iVar2 = (int)CONCAT71(in_register_00000031,mask_type);
  if (iVar2 == 1) {
    lVar1 = (long)src0 * 2;
    lVar6 = (long)src1 * 2;
    if (bd == 8) {
      if (0 < h) {
        iVar2 = 0;
        do {
          if (0 < w) {
            uVar9 = 0;
            do {
              iVar11 = (uint)*(ushort *)(lVar1 + uVar9 * 2) - (uint)*(ushort *)(lVar6 + uVar9 * 2);
              uVar10 = (ushort)iVar11;
              uVar8 = -uVar10;
              if (0 < iVar11) {
                uVar8 = uVar10;
              }
              uVar10 = (uVar8 >> 4) + 0x26;
              uVar7 = '@' - (char)uVar10;
              if (0x40 < uVar10) {
                uVar7 = '\0';
              }
              mask[uVar9] = uVar7;
              uVar9 = uVar9 + 1;
            } while ((uint)w != uVar9);
          }
          mask = mask + w;
          iVar2 = iVar2 + 1;
          lVar1 = lVar1 + (long)src0_stride * 2;
          lVar6 = lVar6 + (long)src1_stride * 2;
        } while (iVar2 != h);
      }
    }
    else if (0 < h) {
      iVar2 = 0;
      do {
        if (0 < w) {
          uVar9 = 0;
          do {
            iVar11 = (uint)*(ushort *)(lVar1 + uVar9 * 2) - (uint)*(ushort *)(lVar6 + uVar9 * 2);
            uVar10 = (ushort)iVar11;
            uVar8 = -uVar10;
            if (0 < iVar11) {
              uVar8 = uVar10;
            }
            uVar10 = ((uVar8 >> ((char)bd - 8U & 0x1f)) >> 4) + 0x26;
            uVar7 = '\0';
            if (uVar10 < 0x41) {
              uVar7 = '@' - (char)uVar10;
            }
            mask[uVar9] = uVar7;
            uVar9 = uVar9 + 1;
          } while ((uint)w != uVar9);
        }
        mask = mask + w;
        iVar2 = iVar2 + 1;
        lVar1 = lVar1 + (long)src0_stride * 2;
        lVar6 = lVar6 + (long)src1_stride * 2;
      } while (iVar2 != h);
    }
  }
  else if (iVar2 == 0) {
    lVar1 = (long)src0 * 2;
    lVar6 = (long)src1 * 2;
    if (bd == 8) {
      if (0 < h) {
        iVar2 = 0;
        do {
          if (0 < w) {
            uVar9 = 0;
            do {
              uVar3 = (uint)*(ushort *)(lVar1 + uVar9 * 2) - (uint)*(ushort *)(lVar6 + uVar9 * 2);
              uVar4 = -uVar3;
              if (0 < (int)uVar3) {
                uVar4 = uVar3;
              }
              uVar5 = ((ulong)uVar4 & 0xffff) >> 4;
              if (0x19 < (uint)uVar5) {
                uVar5 = 0x1a;
              }
              mask[uVar9] = (char)uVar5 + '&';
              uVar9 = uVar9 + 1;
            } while ((uint)w != uVar9);
          }
          mask = mask + w;
          iVar2 = iVar2 + 1;
          lVar1 = lVar1 + (long)src0_stride * 2;
          lVar6 = lVar6 + (long)src1_stride * 2;
        } while (iVar2 != h);
      }
    }
    else if (0 < h) {
      iVar2 = 0;
      do {
        if (0 < w) {
          uVar9 = 0;
          do {
            uVar3 = (uint)*(ushort *)(lVar1 + uVar9 * 2) - (uint)*(ushort *)(lVar6 + uVar9 * 2);
            uVar4 = -uVar3;
            if (0 < (int)uVar3) {
              uVar4 = uVar3;
            }
            uVar4 = ((uVar4 & 0xffff) >> ((char)bd - 8U & 0x1f)) >> 4;
            if (0x19 < uVar4) {
              uVar4 = 0x1a;
            }
            mask[uVar9] = (char)uVar4 + '&';
            uVar9 = uVar9 + 1;
          } while ((uint)w != uVar9);
        }
        mask = mask + w;
        iVar2 = iVar2 + 1;
        lVar1 = lVar1 + (long)src0_stride * 2;
        lVar6 = lVar6 + (long)src1_stride * 2;
      } while (iVar2 != h);
    }
  }
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_highbd_c(
    uint8_t *mask, DIFFWTD_MASK_TYPE mask_type, const uint8_t *src0,
    int src0_stride, const uint8_t *src1, int src1_stride, int h, int w,
    int bd) {
  switch (mask_type) {
    case DIFFWTD_38:
      diffwtd_mask_highbd(mask, 0, 38, CONVERT_TO_SHORTPTR(src0), src0_stride,
                          CONVERT_TO_SHORTPTR(src1), src1_stride, h, w, bd);
      break;
    case DIFFWTD_38_INV:
      diffwtd_mask_highbd(mask, 1, 38, CONVERT_TO_SHORTPTR(src0), src0_stride,
                          CONVERT_TO_SHORTPTR(src1), src1_stride, h, w, bd);
      break;
    default: assert(0);
  }
}